

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void get_mask(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
             cio_read_buffer *buffer,size_t num_bytes)

{
  _Bool _Var1;
  
  _Var1 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var1) {
    memcpy((void *)((long)handler_context + 0x80),buffer->fetch_ptr,num_bytes);
    buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
    read_payload((cio_websocket *)handler_context,buffered_stream,buffer);
    return;
  }
  return;
}

Assistant:

static void get_mask(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);

	memcpy(websocket->ws_private.received_mask, ptr, num_bytes);
	cio_read_buffer_consume(buffer, num_bytes);
	read_payload(websocket, buffered_stream, buffer);
}